

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O1

nng_err nni_http_req_parse(nng_http *conn,void *buf,size_t n,size_t *lenp)

{
  bool bVar1;
  size_t sVar2;
  nng_err nVar3;
  nng_err nVar4;
  nng_http_status nVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  size_t local_60;
  size_t cnt;
  size_t *local_50;
  char *local_48;
  size_t local_40;
  nng_http *local_38;
  
  local_50 = lenp;
  local_38 = conn;
  cnt = (size_t)nni_http_conn_req(conn);
  sVar10 = 0;
  do {
    sVar2 = cnt;
    nVar3 = http_scan_line(buf,n,&local_60);
    nVar4 = NNG_OK;
    if (nVar3 == NNG_OK) {
      sVar10 = sVar10 + local_60;
      pcVar9 = (char *)((long)buf + local_60);
      n = n - local_60;
      local_40 = sVar10;
      if (*buf == '\0') {
        bVar1 = false;
      }
      else {
        if (*(char *)(sVar2 + 0x120) == '\x01') {
          nVar4 = http_parse_header(local_38,buf);
        }
        else {
          *(undefined1 *)(sVar2 + 0x120) = 1;
          nVar5 = nni_http_get_status(local_38);
          nVar4 = NNG_OK;
          if (nVar5 < NNG_HTTP_STATUS_BAD_REQUEST) {
            pcVar7 = strchr((char *)buf,0x20);
            if (pcVar7 == (char *)0x0) {
LAB_0013b1da:
              nVar5 = NNG_HTTP_STATUS_BAD_REQUEST;
            }
            else {
              *pcVar7 = '\0';
              pcVar7 = pcVar7 + 1;
              pcVar8 = strchr(pcVar7,0x20);
              if (pcVar8 == (char *)0x0) goto LAB_0013b1da;
              *pcVar8 = '\0';
              local_48 = pcVar8;
              iVar6 = nni_url_canonify_uri(pcVar7);
              if (iVar6 != 0) goto LAB_0013b1da;
              iVar6 = nni_http_set_version(local_38,local_48 + 1);
              if (iVar6 == 0) {
                nni_http_set_method(local_38,(char *)buf);
                nVar4 = nni_http_set_uri(local_38,pcVar7,(char *)0x0);
                goto LAB_0013b1ed;
              }
              nVar5 = NNG_HTTP_STATUS_HTTP_VERSION_NOT_SUPP;
            }
            nVar4 = NNG_OK;
            nni_http_set_status(local_38,nVar5,(char *)0x0);
          }
        }
LAB_0013b1ed:
        bVar1 = true;
        sVar10 = local_40;
      }
    }
    else {
      bVar1 = false;
      pcVar9 = (char *)buf;
      nVar4 = nVar3;
    }
    buf = pcVar9;
    if (!bVar1) {
      if (nVar4 != NNG_EAGAIN) {
        *(undefined1 *)(cnt + 0x120) = 0;
      }
      *local_50 = sVar10;
      return nVar4;
    }
  } while( true );
}

Assistant:

nng_err
nni_http_req_parse(nng_http *conn, void *buf, size_t n, size_t *lenp)
{

	size_t        len = 0;
	size_t        cnt;
	int           rv  = 0;
	nni_http_req *req = nni_http_conn_req(conn);

	for (;;) {
		uint8_t *line;
		if ((rv = http_scan_line(buf, n, &cnt)) != 0) {
			break;
		}

		len += cnt;
		line = buf;
		buf  = line + cnt;
		n -= cnt;

		if (*line == '\0') {
			break;
		}

		if (req->data.parsed) {
			rv = http_parse_header(conn, line);
		} else {
			req->data.parsed = true;
			rv               = http_req_parse_line(conn, line);
		}
	}

	if (rv != NNG_EAGAIN) {
		req->data.parsed = false;
	}
	*lenp = len;
	return (rv);
}